

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibTable.cpp
# Opt level: O0

int lib::table::Unpack(State *state)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  State *in_RDI;
  double dVar4;
  Value VVar5;
  int i;
  Value key;
  int count;
  int end;
  int begin;
  Table *table;
  int params;
  StackAPI api;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  StackAPI *in_stack_ffffffffffffff98;
  ValueT in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_3c;
  int local_38;
  int local_34;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT,luna::ValueT,luna::ValueT>
                    ((StackAPI *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                     (ValueT)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                     (ValueT)in_stack_ffffffffffffff98);
  if (bVar1) {
    iVar2 = luna::StackAPI::GetStackSize
                      ((StackAPI *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    luna::StackAPI::GetTable(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    local_34 = 1;
    sVar3 = luna::Table::ArraySize
                      ((Table *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    local_38 = (int)sVar3;
    if (1 < iVar2) {
      dVar4 = luna::StackAPI::GetNumber(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      local_34 = (int)dVar4;
    }
    if (2 < iVar2) {
      dVar4 = luna::StackAPI::GetNumber(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      local_38 = (int)dVar4;
    }
    local_3c = 0;
    luna::Value::Value((Value *)&stack0xffffffffffffffb0);
    for (; local_34 <= local_38; local_34 = local_34 + 1) {
      VVar5 = luna::Table::GetValue
                        ((Table *)(double)local_34,
                         (Value *)CONCAT44(local_34,in_stack_ffffffffffffffa8));
      luna::StackAPI::PushValue
                ((StackAPI *)CONCAT44(in_stack_ffffffffffffff94,VVar5.type_),
                 (Value *)VVar5.field_0.obj_);
      local_3c = local_3c + 1;
    }
    local_4 = local_3c;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Unpack(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Table,
                           luna::ValueT_Number, luna::ValueT_Number))
            return 0;

        auto params = api.GetStackSize();
        auto table = api.GetTable(0);

        int begin = 1;
        int end = table->ArraySize();
        if (params > 1)
            begin = static_cast<int>(api.GetNumber(1));
        if (params > 2)
            end = static_cast<int>(api.GetNumber(2));

        int count = 0;
        luna::Value key;
        key.type_ = luna::ValueT_Number;
        for (int i = begin; i <= end; ++i)
        {
            key.num_ = i;
            api.PushValue(table->GetValue(key));
            ++count;
        }

        return count;
    }